

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptorProto::MergeFrom
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  byte bVar1;
  int32 iVar2;
  int iVar3;
  LogMessage *other;
  string *psVar4;
  FieldOptions *pFVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xb7a);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar4 = (string *)operator_new(0x20);
        (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        psVar4->_M_string_length = 0;
        (psVar4->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar4;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      iVar2 = from->number_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->number_ = iVar2;
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      iVar3 = from->label_;
      if (2 < iVar3 - 1U) {
        __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                      ,0xe16,
                      "void google::protobuf::FieldDescriptorProto::set_label(::google::protobuf::FieldDescriptorProto_Label)"
                     );
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      this->label_ = iVar3;
    }
    if ((from->_has_bits_[0] & 8) != 0) {
      iVar3 = from->type_;
      if (0x11 < iVar3 - 1U) {
        __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                      ,0xe2d,
                      "void google::protobuf::FieldDescriptorProto::set_type(::google::protobuf::FieldDescriptorProto_Type)"
                     );
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
      this->type_ = iVar3;
    }
    if ((from->_has_bits_[0] & 0x10) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x10;
      if (this->type_name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar4 = (string *)operator_new(0x20);
        (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        psVar4->_M_string_length = 0;
        (psVar4->field_2)._M_local_buf[0] = '\0';
        this->type_name_ = psVar4;
      }
      std::__cxx11::string::_M_assign((string *)this->type_name_);
    }
    if ((from->_has_bits_[0] & 0x20) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x20;
      if (this->extendee_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar4 = (string *)operator_new(0x20);
        (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        psVar4->_M_string_length = 0;
        (psVar4->field_2)._M_local_buf[0] = '\0';
        this->extendee_ = psVar4;
      }
      std::__cxx11::string::_M_assign((string *)this->extendee_);
    }
    if ((from->_has_bits_[0] & 0x40) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x40;
      if (this->default_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar4 = (string *)operator_new(0x20);
        (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        psVar4->_M_string_length = 0;
        (psVar4->field_2)._M_local_buf[0] = '\0';
        this->default_value_ = psVar4;
      }
      std::__cxx11::string::_M_assign((string *)this->default_value_);
    }
    if ((from->_has_bits_[0] & 0x80) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x80;
      if (this->options_ == (FieldOptions *)0x0) {
        pFVar5 = (FieldOptions *)operator_new(0x70);
        FieldOptions::FieldOptions(pFVar5);
        this->options_ = pFVar5;
      }
      pFVar5 = from->options_;
      if (pFVar5 == (FieldOptions *)0x0) {
        pFVar5 = *(FieldOptions **)(default_instance_ + 0x38);
      }
      FieldOptions::MergeFrom(this->options_,pFVar5);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FieldDescriptorProto::MergeFrom(const FieldDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_number()) {
      set_number(from.number());
    }
    if (from.has_label()) {
      set_label(from.label());
    }
    if (from.has_type()) {
      set_type(from.type());
    }
    if (from.has_type_name()) {
      set_type_name(from.type_name());
    }
    if (from.has_extendee()) {
      set_extendee(from.extendee());
    }
    if (from.has_default_value()) {
      set_default_value(from.default_value());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FieldOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}